

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_regexp.cc
# Opt level: O1

RegExp * re2c::UTF8Symbol(rune r)

{
  _func_int **pp_Var1;
  uint32_t uVar2;
  RegExp *pRVar3;
  Range *pRVar4;
  RegExp *pRVar5;
  ulong uVar6;
  uint32_t chars [4];
  RegExp *local_80;
  _func_int **local_78;
  ulong local_70;
  _func_int **local_68;
  _func_int **local_60;
  ulong local_58;
  RegExp *local_50;
  uint32_t local_48 [6];
  
  uVar2 = utf8::rune_to_bytes(local_48,r);
  pRVar3 = (RegExp *)operator_new(0x10);
  pRVar4 = Range::sym(local_48[0]);
  pRVar3->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cd10;
  local_80 = pRVar3;
  std::
  _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
  ::_M_insert_unique<re2c::RegExp*>
            ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
              *)RegExp::vFreeList,&local_80);
  local_60 = (_func_int **)&PTR__RegExp_0015cbf0;
  pRVar3->_vptr_RegExp = (_func_int **)&PTR__RegExp_0015cbf0;
  pRVar3[1]._vptr_RegExp = (_func_int **)pRVar4;
  if (1 < uVar2) {
    local_68 = (_func_int **)&PTR__RegExp_0015cd10;
    local_70 = (ulong)uVar2;
    uVar6 = 1;
    local_78 = (_func_int **)&PTR__RegExp_0015cb30;
    do {
      local_50 = pRVar3;
      pRVar3 = (RegExp *)operator_new(0x18);
      pRVar5 = (RegExp *)operator_new(0x10);
      local_58 = uVar6;
      pRVar4 = Range::sym(local_48[uVar6]);
      pp_Var1 = local_68;
      pRVar5->_vptr_RegExp = local_68;
      local_80 = pRVar5;
      std::
      _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
      ::_M_insert_unique<re2c::RegExp*>
                ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                  *)RegExp::vFreeList,&local_80);
      pRVar5->_vptr_RegExp = local_60;
      pRVar5[1]._vptr_RegExp = (_func_int **)pRVar4;
      pRVar3->_vptr_RegExp = pp_Var1;
      local_80 = pRVar3;
      std::
      _Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
      ::_M_insert_unique<re2c::RegExp*>
                ((_Rb_tree<re2c::RegExp*,re2c::RegExp*,std::_Identity<re2c::RegExp*>,std::less<re2c::RegExp*>,std::allocator<re2c::RegExp*>>
                  *)RegExp::vFreeList,&local_80);
      pRVar3->_vptr_RegExp = local_78;
      pRVar3[1]._vptr_RegExp = (_func_int **)local_50;
      pRVar3[2]._vptr_RegExp = (_func_int **)pRVar5;
      uVar6 = local_58 + 1;
    } while (local_70 != uVar6);
  }
  return pRVar3;
}

Assistant:

RegExp * UTF8Symbol(utf8::rune r)
{
	uint32_t chars[utf8::MAX_RUNE_LENGTH];
	const uint32_t chars_count = utf8::rune_to_bytes(chars, r);
	RegExp * re = new MatchOp(Range::sym (chars[0]));
	for (uint32_t i = 1; i < chars_count; ++i)
		re = new CatOp(re, new MatchOp(Range::sym (chars[i])));
	return re;
}